

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkLogicMakeSimpleCosTest(Abc_Ntk_t *pNtk,int fDuplicate)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  uint local_58 [2];
  int Inputs [2];
  int Consts [2];
  int Counts [4];
  uint local_2c;
  int i;
  Abc_Obj_t *pNode;
  uint *pType;
  int nObjs;
  int fDuplicate_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkObjNumMax(pNtk);
  __ptr = calloc((long)iVar2,4);
  memset(Consts,0,0x10);
  memset(Inputs,0,8);
  memset(local_58,0,8);
  for (local_2c = 0; iVar3 = Abc_NtkCoNum(pNtk), (int)local_2c < iVar3; local_2c = local_2c + 1) {
    pObj = Abc_NtkCo(pNtk,local_2c);
    iVar3 = Abc_ObjFaninId0(pObj);
    if (iVar3 == 0) {
      iVar3 = Abc_ObjFaninC0(pObj);
      Inputs[iVar3] = Inputs[iVar3] + 1;
    }
    pObj_00 = Abc_ObjFanin0(pObj);
    iVar3 = Abc_ObjIsCi(pObj_00);
    if (iVar3 != 0) {
      iVar3 = Abc_ObjFaninC0(pObj);
      Inputs[(long)iVar3 + -2] = Inputs[(long)iVar3 + -2] + 1;
    }
    iVar3 = Abc_ObjFaninC0(pObj);
    iVar4 = Abc_ObjFaninId0(pObj);
    *(uint *)((long)__ptr + (long)iVar4 * 4) =
         1 << ((byte)iVar3 & 0x1f) | *(uint *)((long)__ptr + (long)iVar4 * 4);
  }
  for (local_2c = 0; (int)local_2c < iVar2; local_2c = local_2c + 1) {
    uVar1 = *(uint *)((long)__ptr + (long)(int)local_2c * 4);
    Consts[uVar1] = Consts[uVar1] + 1;
  }
  for (local_2c = 0; (int)local_2c < 4; local_2c = local_2c + 1) {
    printf("%d = %d     ",(ulong)local_2c,(ulong)(uint)Consts[(int)local_2c]);
  }
  for (local_2c = 0; (int)local_2c < 2; local_2c = local_2c + 1) {
    printf("c%d = %d     ",(ulong)local_2c,(ulong)(uint)Inputs[(int)local_2c]);
  }
  for (local_2c = 0; (int)local_2c < 2; local_2c = local_2c + 1) {
    printf("i%d = %d    ",(ulong)local_2c,(ulong)(uint)Inputs[(long)(int)local_2c + -2]);
  }
  printf("\n");
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Abc_NtkLogicMakeSimpleCosTest( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int nObjs = Abc_NtkObjNumMax(pNtk);
    unsigned * pType = ABC_CALLOC( unsigned, nObjs );
    Abc_Obj_t * pNode;
    int i, Counts[4] = {0}, Consts[2] = {0}, Inputs[2] = {0};
    // collect info
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( Abc_ObjFaninId0(pNode) == 0 )
            Consts[Abc_ObjFaninC0(pNode)]++;
        if ( Abc_ObjIsCi(Abc_ObjFanin0(pNode)) )
            Inputs[Abc_ObjFaninC0(pNode)]++;
        pType[Abc_ObjFaninId0(pNode)] |= (1 << Abc_ObjFaninC0(pNode));
    }
    // count the numbers
    for ( i = 0; i < nObjs; i++ )
        Counts[pType[i]]++;
    for ( i = 0; i < 4; i++ )
        printf( "%d = %d     ", i, Counts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "c%d = %d     ", i, Consts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "i%d = %d    ", i, Inputs[i] );
    printf( "\n" );
    ABC_FREE( pType );
}